

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_match_prefix(char *pattern,int pattern_len,char *str)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  void *pvVar5;
  __int32_t **pp_Var6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  
  sVar11 = (size_t)pattern_len;
  pvVar5 = memchr(pattern,0x7c,sVar11);
  while (pvVar5 != (void *)0x0) {
    iVar4 = (int)pattern;
    iVar2 = mg_match_prefix(pattern,(int)pvVar5 - iVar4,str);
    if (0 < iVar2) {
      return iVar2;
    }
    pattern = (char *)((long)pvVar5 + 1);
    pattern_len = (iVar4 + (int)sVar11) - (int)pattern;
    sVar11 = (size_t)pattern_len;
    pvVar5 = memchr(pattern,0x7c,sVar11);
  }
  if (pattern_len < 1) {
    return 0;
  }
  uVar13 = 0;
  do {
    bVar1 = pattern[uVar13];
    if (bVar1 == 0x3f) {
      if (str[uVar13] == '\0') {
        uVar9 = 0;
        goto LAB_0010f058;
      }
    }
    else {
      uVar12 = (uint)uVar13;
      if (bVar1 == 0x24) {
        return -(uint)(str[uVar13] != '\0') | uVar12;
      }
      if (bVar1 == 0x2a) {
        if (pattern[uVar13 + 1] == '*') {
          uVar8 = uVar12 + 2;
          sVar11 = strlen(str + uVar13);
          uVar3 = (uint)sVar11;
        }
        else {
          uVar8 = uVar12 + 1;
          sVar11 = strcspn(str + uVar13,"/");
          uVar3 = (uint)sVar11;
        }
        if (pattern_len == uVar8) {
          return uVar3 + uVar12;
        }
        iVar2 = ((int)uVar3 >> 0x1f & uVar3) - 1;
        lVar10 = 0;
        break;
      }
      uVar9 = (ulong)(byte)str[uVar13];
LAB_0010f058:
      pp_Var6 = __ctype_tolower_loc();
      if ((*pp_Var6)[bVar1] != (*pp_Var6)[uVar9]) {
        return -1;
      }
    }
    uVar13 = uVar13 + 1;
    if ((uint)pattern_len == uVar13) {
      return pattern_len;
    }
  } while( true );
  while (lVar7 = lVar10 + (int)uVar3, lVar10 = lVar10 + -1, 0 < lVar7) {
    iVar4 = mg_match_prefix(pattern + (int)uVar8,pattern_len - uVar8,
                            str + lVar10 + (long)(int)uVar3 + uVar13);
    if (iVar4 != -1) {
      iVar2 = uVar3 + (int)lVar10;
      break;
    }
  }
  iVar2 = uVar12 + iVar2 + iVar4;
  if (iVar4 == -1) {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int mg_match_prefix(const char *pattern, int pattern_len, const char *str) {
    const char *or_str;
    int len, res, i = 0, j = 0;

    if ((or_str = (const char *) memchr(pattern, '|', pattern_len)) != NULL) {
        res = mg_match_prefix(pattern, or_str - pattern, str);
        return res > 0 ? res : mg_match_prefix(
                or_str + 1,
                (pattern + pattern_len) - (or_str + 1), str);
    }

    for (; i < pattern_len; i++, j++) {
        if (pattern[i] == '?' && str[j] != '\0') {
            continue;
        } else if (pattern[i] == '$') {
            return str[j] == '\0' ? j : -1;
        } else if (pattern[i] == '*') {
            i++;
            if (pattern[i] == '*') {
                i++;
                len = (int) strlen(str + j);
            } else {
                len = (int) strcspn(str + j, "/");
            }
            if (i == pattern_len) {
                return j + len;
            }
            do {
                res = mg_match_prefix(pattern + i, pattern_len - i, str + j + len);
            } while (res == -1 && len-- > 0);
            return res == -1 ? -1 : j + res + len;
        } else if (lowercase(&pattern[i]) != lowercase(&str[j])) {
            return -1;
        }
    }
    return j;
}